

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O0

void asmjit::X86RAPass_assignStackArgsRegId(X86RAPass *self,CCFunc *func)

{
  uint uVar1;
  long in_RSI;
  long in_RDI;
  uint32_t regs;
  uint32_t used;
  uint32_t passed;
  uint32_t stackArgsRegId;
  FuncFrameInfo *ffi;
  FuncDetail *fd;
  char *in_stack_00000320;
  int in_stack_0000032c;
  char *in_stack_00000330;
  undefined4 local_c0;
  undefined1 local_b4;
  undefined4 local_34;
  
  if ((*(uint *)(in_RSI + 0x120) & 1) == 0) {
    uVar1 = *(uint *)(in_RSI + 0x84) | 0x10;
    local_c0 = *(uint *)(in_RSI + 0x60) & (uVar1 ^ 0xffffffff);
    if (local_c0 == 0) {
      local_c0 = (*(uint *)(in_RSI + 0x60) ^ 0xffffffff) & (uVar1 ^ 0xffffffff);
    }
    if (local_c0 == 0) {
      local_34 = 0xffffffff;
    }
    else {
      local_34 = 0;
      for (; (local_c0 & 1) == 0; local_c0 = local_c0 >> 1 | 0x80000000) {
        local_34 = local_34 + 1;
      }
    }
    local_b4 = (undefined1)local_34;
    if (*(byte *)(*(long *)(in_RDI + 8) + 0xb) <= local_34) {
      DebugUtils::assertionFailed(in_stack_00000330,in_stack_0000032c,in_stack_00000320);
    }
  }
  else {
    local_b4 = 5;
  }
  *(undefined1 *)(in_RSI + 0x136) = local_b4;
  return;
}

Assistant:

static void X86RAPass_assignStackArgsRegId(X86RAPass* self, CCFunc* func) {
  const FuncDetail& fd = func->getDetail();
  FuncFrameInfo& ffi = func->getFrameInfo();

  // Select some register which will contain the base address of function
  // arguments and return address. The algorithm tries to select registers
  // which are saved or not preserved by default, if not successful it picks
  // any other register and adds it to `_savedRegs`.
  uint32_t stackArgsRegId;
  if (ffi.hasPreservedFP()) {
    stackArgsRegId = X86Gp::kIdBp;
  }
  else {
    // Passed registers as defined by the calling convention.
    uint32_t passed = fd.getPassedRegs(X86Reg::kKindGp);

    // Registers actually used to pass function arguments (related to this
    // function signature) with ESP|RSP included as this register can't be
    // used in general to hold anything bug stack pointer.
    uint32_t used = fd.getUsedRegs(X86Reg::kKindGp) | Utils::mask(X86Gp::kIdSp);

    // First try register that is defined to pass a function argument by the
    // calling convention, but is not used by this function. This will most
    // likely fail in 32-bit mode, but there is a high chance that it will
    // pass in 64-bit mode if the function doesn't use so many arguments.
    uint32_t regs = passed & ~used;

    // Pick any other register if that didn't work out.
    if (!regs) regs = ~passed & ~used;

    stackArgsRegId = Utils::findFirstBit(regs);
    ASMJIT_ASSERT(stackArgsRegId < self->cc()->getGpCount());
  }

  ffi.setStackArgsRegId(stackArgsRegId);
}